

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_neg(secp256k1_ge *r,secp256k1_ge *a)

{
  long lVar1;
  secp256k1_ge *psVar2;
  
  psVar2 = r;
  for (lVar1 = 0xb; lVar1 != 0; lVar1 = lVar1 + -1) {
    (psVar2->x).n[0] = (a->x).n[0];
    a = (secp256k1_ge *)((a->x).n + 1);
    psVar2 = (secp256k1_ge *)((psVar2->x).n + 1);
  }
  secp256k1_fe_normalize_weak(&r->y);
  (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
  (r->y).n[1] = 0x3ffffffffffffc - (r->y).n[1];
  (r->y).n[2] = 0x3ffffffffffffc - (r->y).n[2];
  (r->y).n[3] = 0x3ffffffffffffc - (r->y).n[3];
  (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
  return;
}

Assistant:

static void secp256k1_ge_neg(secp256k1_ge *r, const secp256k1_ge *a) {
    *r = *a;
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_negate(&r->y, &r->y, 1);
}